

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  pointer pcVar3;
  bool bVar4;
  LayerUnion LVar5;
  long *plVar6;
  size_type *psVar7;
  Result *_result;
  string err;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      if (layer->_oneof_case_[0] == 0x4b0) {
        LVar5 = layer->layer_;
      }
      else {
        LVar5.randomuniformdynamic_ =
             Specification::RandomUniformDynamicLayerParams::default_instance();
      }
      pfVar2 = (float *)((long)&((LVar5.convolution_)->kernelsize_).rep_ + 4);
      if ((LVar5.unary_)->epsilon_ < *pfVar2 || (LVar5.unary_)->epsilon_ == *pfVar2) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::operator+(&local_38,"Value of minval should be smaller than maxval for \'",
                       (layer->name_).ptr_);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_38);
        psVar7 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58.field_2._8_8_ = plVar6[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar7;
          local_58._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_58._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randomuniformdynamic();
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}